

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stage2RunnerNonRecursive.hpp
# Opt level: O3

void __thiscall
Centaurus::Stage2Runner::Stage2Runner
          (Stage2Runner *this,char *filename,size_t bank_size,int bank_num,int master_pid,
          void *context,atomic<int> *counter)

{
  sem_t *psVar1;
  
  BaseRunner::BaseRunner((BaseRunner *)this,filename,bank_size,bank_num,master_pid);
  (this->super_NonRecursiveReductionRunner).m_listener = (ReductionListener)0x0;
  (this->super_NonRecursiveReductionRunner).m_xferlistener = (TransferListener)0x0;
  (this->super_NonRecursiveReductionRunner).m_listener_context = context;
  (this->super_NonRecursiveReductionRunner).reduction_counter = counter;
  (this->super_NonRecursiveReductionRunner).super_BaseRunner.super_BaseListener._vptr_BaseListener =
       (_func_int **)&PTR__Stage2Runner_001a03f0;
  BaseRunner::acquire_memory((BaseRunner *)this,false);
  psVar1 = sem_open((this->super_NonRecursiveReductionRunner).super_BaseRunner.m_slave_lock_name,0);
  (this->super_NonRecursiveReductionRunner).super_BaseRunner.m_slave_lock = (sem_t *)psVar1;
  return;
}

Assistant:

Stage2Runner(const char *filename, size_t bank_size, int bank_num, int master_pid, void *context = nullptr, std::atomic<int> *counter = nullptr)
    : NonRecursiveReductionRunner(filename, bank_size, bank_num, master_pid, context, counter)
  {
    acquire_memory(false);
    open_semaphore();
  }